

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O1

RegexMatcher * __thiscall
icu_63::RegexMatcher::appendReplacement
          (RegexMatcher *this,UnicodeString *dest,UnicodeString *replacement,UErrorCode *status)

{
  UText replacementText;
  UText resultText;
  UText local_148;
  UText local_b8;
  
  memset(&local_148,0,0x90);
  local_148.magic = 0x345ad82c;
  local_148.sizeOfStruct = 0x90;
  utext_openConstUnicodeString_63(&local_148,replacement,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    memset(&local_b8,0,0x90);
    local_b8.magic = 0x345ad82c;
    local_b8.sizeOfStruct = 0x90;
    utext_openUnicodeString_63(&local_b8,dest,status);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      appendReplacement(this,&local_b8,&local_148,status);
      utext_close_63(&local_b8);
    }
    utext_close_63(&local_148);
  }
  return this;
}

Assistant:

RegexMatcher &RegexMatcher::appendReplacement(UnicodeString &dest,
                                              const UnicodeString &replacement,
                                              UErrorCode &status) {
    UText replacementText = UTEXT_INITIALIZER;

    utext_openConstUnicodeString(&replacementText, &replacement, &status);
    if (U_SUCCESS(status)) {
        UText resultText = UTEXT_INITIALIZER;
        utext_openUnicodeString(&resultText, &dest, &status);

        if (U_SUCCESS(status)) {
            appendReplacement(&resultText, &replacementText, status);
            utext_close(&resultText);
        }
        utext_close(&replacementText);
    }

    return *this;
}